

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O2

void __thiscall CaDiCaL::External::check_solution_on_learned_clause(External *this)

{
  uint uVar1;
  int iVar2;
  int elit;
  uint uVar3;
  int *lit;
  uint *puVar4;
  uint *puVar5;
  
  puVar5 = (uint *)(this->internal->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  puVar4 = (uint *)(this->internal->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  do {
    if (puVar4 == puVar5) {
      fatal_message_start();
      fputs("learned clause unsatisfied by solution:\n",_stderr);
      puVar4 = (uint *)(this->internal->clause).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
      for (puVar5 = (uint *)(this->internal->clause).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar4;
          puVar5 = puVar5 + 1) {
        fprintf(_stderr,"%d ",(ulong)*puVar5);
      }
      fputc(0x30,_stderr);
      fatal_message_end();
      return;
    }
    uVar1 = *puVar4;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    iVar2 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    elit = -iVar2;
    if (-1 < (int)uVar1) {
      elit = iVar2;
    }
    uVar3 = sol(this,elit);
    uVar1 = *puVar4;
    puVar4 = puVar4 + 1;
  } while (uVar3 != uVar1);
  return;
}

Assistant:

void External::check_solution_on_learned_clause () {
  assert (solution);
  for (const auto &lit : internal->clause)
    if (sol (internal->externalize (lit)) == lit)
      return;
  fatal_message_start ();
  fputs ("learned clause unsatisfied by solution:\n", stderr);
  for (const auto &lit : internal->clause)
    fprintf (stderr, "%d ", lit);
  fputc ('0', stderr);
  fatal_message_end ();
}